

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::generateTableDecl(CodegenVisitor *this,TableDecl *tableDecl)

{
  ulong uVar1;
  TreeOp TVar2;
  size_type_conflict sVar3;
  int iVar4;
  LiteralKind LVar5;
  LiteralExpr *pLVar6;
  SQFuncState *this_00;
  TableDecl *in_RSI;
  Expr *in_RDI;
  SQInteger table;
  SQInteger key;
  SQInteger val;
  SQInteger constantI;
  bool isConstKey;
  TableMember *m;
  SQUnsignedInteger i;
  ArenaVector<SQCompilation::Expr_*> memberConstantKeys;
  ArenaVector<SQCompilation::TableMember> *members;
  bool isKlass;
  undefined1 in_stack_fffffffffffffeef;
  SQObjectPtr *in_stack_fffffffffffffef0;
  SQFuncState *in_stack_fffffffffffffef8;
  SQFuncState *in_stack_ffffffffffffff00;
  undefined1 *in_stack_ffffffffffffff08;
  SQFuncState *in_stack_ffffffffffffff10;
  SQInteger in_stack_ffffffffffffff18;
  SQFuncState *in_stack_ffffffffffffff20;
  SQInteger len;
  SQChar *s;
  byte local_b9;
  ArenaVector<SQCompilation::Expr_*> *in_stack_ffffffffffffff60;
  SQFuncState *in_stack_ffffffffffffff68;
  undefined1 local_78 [16];
  SQObject local_68;
  SQFuncState *local_58;
  byte local_49;
  TableMember *local_48;
  ulong local_40;
  ArenaVector<SQCompilation::Expr_*> local_38;
  ArenaVector<SQCompilation::TableMember> *local_20;
  byte local_11;
  TableDecl *local_10;
  
  local_10 = in_RSI;
  TVar2 = Node::op((Node *)in_RSI);
  local_11 = TVar2 == TO_CLASS;
  local_20 = TableDecl::members(local_10);
  ArenaVector<SQCompilation::Expr_*>::ArenaVector
            (&local_38,*(Arena **)&in_RDI[3].super_Node._coordinates);
  for (local_40 = 0; uVar1 = local_40,
      sVar3 = ArenaVector<SQCompilation::TableMember>::size(local_20), uVar1 < sVar3;
      local_40 = local_40 + 1) {
    local_48 = ArenaVector<SQCompilation::TableMember>::operator[]
                         (local_20,(size_type_conflict)local_40);
    if ((local_40 < 100) && (iVar4 = Node::lineStart(&local_48->key->super_Node), iVar4 != -1)) {
      Node::lineStart(&local_48->key->super_Node);
      SQFuncState::AddLineInfos
                (in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                 SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffef0 >> 0x30,0));
    }
    CheckMemberUniqueness
              ((CodegenVisitor *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RDI);
    TVar2 = Node::op(&local_48->key->super_Node);
    local_b9 = 0;
    if (TVar2 == TO_LITERAL) {
      local_b9 = local_11 ^ 0xff;
    }
    local_49 = local_b9 & 1;
    if (local_49 != 0) {
      pLVar6 = Expr::asLiteral(local_48->key);
      LVar5 = LiteralExpr::kind(pLVar6);
      this_00 = (SQFuncState *)(ulong)LVar5;
      switch(this_00) {
      case (SQFuncState *)0x0:
        s = *(SQChar **)&(in_RDI->super_Node)._coordinates;
        len._0_4_ = (in_RDI->super_Node)._coordinates.lineStart;
        len._4_4_ = (in_RDI->super_Node)._coordinates.columnStart;
        pLVar6 = Expr::asLiteral(local_48->key);
        LiteralExpr::s(pLVar6);
        local_68 = SQFuncState::CreateString(this_00,s,len);
        local_58 = (SQFuncState *)
                   SQFuncState::GetConstant
                             (in_stack_ffffffffffffff68,(SQObject *)in_stack_ffffffffffffff60,
                              (int)((ulong)in_RDI >> 0x20));
        break;
      case (SQFuncState *)0x1:
        in_stack_ffffffffffffff20 = *(SQFuncState **)&(in_RDI->super_Node)._coordinates;
        pLVar6 = Expr::asLiteral(local_48->key);
        LiteralExpr::i(pLVar6);
        local_58 = (SQFuncState *)
                   SQFuncState::GetNumericConstant
                             (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        break;
      case (SQFuncState *)0x2:
        in_stack_ffffffffffffff18._0_4_ = (in_RDI->super_Node)._coordinates.lineStart;
        in_stack_ffffffffffffff18._4_4_ = (in_RDI->super_Node)._coordinates.columnStart;
        pLVar6 = Expr::asLiteral(local_48->key);
        LiteralExpr::f(pLVar6);
        local_58 = (SQFuncState *)
                   SQFuncState::GetNumericConstant
                             (in_stack_ffffffffffffff20,
                              (SQFloat)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        break;
      case (SQFuncState *)0x3:
        in_stack_ffffffffffffff00 = *(SQFuncState **)&(in_RDI->super_Node)._coordinates;
        pLVar6 = Expr::asLiteral(local_48->key);
        LiteralExpr::b(pLVar6);
        in_stack_ffffffffffffff08 = local_78;
        ::SQObjectPtr::SQObjectPtr(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
        in_stack_ffffffffffffff10 =
             (SQFuncState *)
             SQFuncState::GetConstant
                       (in_stack_ffffffffffffff68,(SQObject *)in_stack_ffffffffffffff60,
                        (int)((ulong)in_RDI >> 0x20));
        local_58 = in_stack_ffffffffffffff10;
        ::SQObjectPtr::~SQObjectPtr(in_stack_fffffffffffffef0);
        break;
      default:
      }
    }
    if ((local_49 & 1) == 0) {
      visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff00,(Node *)in_stack_fffffffffffffef8);
    }
    visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff00,(Node *)in_stack_fffffffffffffef8);
    SQFuncState::PopTarget(in_stack_ffffffffffffff00);
    in_stack_fffffffffffffef8 = local_58;
    if ((local_49 & 1) == 0) {
      in_stack_fffffffffffffef8 = (SQFuncState *)SQFuncState::PopTarget(in_stack_ffffffffffffff00);
    }
    in_stack_ffffffffffffff68 = in_stack_fffffffffffffef8;
    in_stack_ffffffffffffff60 =
         (ArenaVector<SQCompilation::Expr_*> *)SQFuncState::TopTarget((SQFuncState *)0x1c5687);
    if ((local_11 & 1) == 0) {
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (SQInteger)in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
    else {
      in_stack_fffffffffffffef0 = *(SQObjectPtr **)&(in_RDI->super_Node)._coordinates;
      TableMember::isStatic(local_48);
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (SQInteger)in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
  }
  return;
}

Assistant:

void CodegenVisitor::generateTableDecl(TableDecl *tableDecl) {
    bool isKlass = tableDecl->op() == TO_CLASS;
    const auto &members = tableDecl->members();

    ArenaVector<Expr *> memberConstantKeys(_arena);

    for (SQUnsignedInteger i = 0; i < members.size(); ++i) {
        const TableMember &m = members[i];
#if SQ_LINE_INFO_IN_STRUCTURES
        if (i < 100 && m.key->lineStart() != -1) {
            _fs->AddLineInfos(m.key->lineStart(), false, false);
        }
#endif
        CheckMemberUniqueness(memberConstantKeys, m.key);

        bool isConstKey = m.key->op() == TO_LITERAL && !isKlass;
        SQInteger constantI;
        if (isConstKey)
        {
          switch(m.key->asLiteral()->kind())
          {
            case LK_STRING: constantI = _fs->GetConstant(_fs->CreateString(m.key->asLiteral()->s())); break;
            case LK_INT: constantI = _fs->GetNumericConstant(m.key->asLiteral()->i()); break;
            case LK_FLOAT: constantI = _fs->GetNumericConstant(m.key->asLiteral()->f()); break;
            case LK_BOOL: constantI = _fs->GetConstant(SQObjectPtr(m.key->asLiteral()->b())); break;
            default:case LK_NULL: assert(0); break;
          }
          //isConstKey = constantI < 256; // since currently we store in arg1, it is sufficient
        }

        if (!isConstKey)
          visitForceGet(m.key);
        visitForceGet(m.value);

        SQInteger val = _fs->PopTarget();
        SQInteger key = isConstKey ? constantI : _fs->PopTarget();
        SQInteger table = _fs->TopTarget(); //<<BECAUSE OF THIS NO COMMON EMIT FUNC IS POSSIBLE
        assert(table < 256);

        if (isKlass) {
            _fs->AddInstruction(_OP_NEWSLOTA, m.isStatic() ? NEW_SLOT_STATIC_FLAG : 0, table, key, val);
        }
        else {
            _fs->AddInstruction(isConstKey ? _OP_NEWSLOTK : _OP_NEWSLOT, 0xFF, key, table, val);
        }
    }
}